

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void av1_get_second_pass_params(AV1_COMP *cpi,EncodeFrameParams *frame_params,uint frame_flags)

{
  double *pdVar1;
  FIRSTPASS_INFO *firstpass_info;
  int64_t *piVar2;
  GF_GROUP *gf_group;
  FRAME_UPDATE_TYPE FVar3;
  byte bVar4;
  aom_enc_pass aVar5;
  AV1_PRIMARY *pAVar6;
  AV1_PRIMARY *pAVar7;
  FIRSTPASS_STATS *pFVar8;
  lookahead_ctx *lookahead;
  STATS_BUFFER_CTX *pSVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  FIRSTPASS_STATS *pFVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int boost;
  long lVar19;
  FIRSTPASS_STATS *pFVar20;
  int *piVar21;
  AV1_PRIMARY *pAVar22;
  long lVar23;
  FIRSTPASS_STATS *pFVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  double dVar34;
  double zero_motion_accumulator;
  FIRSTPASS_STATS this_frame;
  FIRSTPASS_STATS this_frame_copy;
  double local_218;
  double local_210;
  double local_208;
  FIRSTPASS_STATS local_200;
  undefined1 local_118 [232];
  
  pAVar6 = cpi->ppi;
  gf_group = &pAVar6->gf_group;
  if ((cpi->use_ducky_encode != 0) && ((cpi->ducky_encode_info).frame_info.gop_mode == '\x01')) {
    uVar14 = (ulong)cpi->gf_frame_index;
    frame_params->frame_type = (pAVar6->gf_group).frame_type[uVar14];
    FVar3 = (pAVar6->gf_group).update_type[uVar14];
    frame_params->show_frame = (uint)(FVar3 != '\x06' && FVar3 != '\x03');
    if (uVar14 != 0) {
      return;
    }
    av1_tf_info_reset(&pAVar6->tf_info);
    av1_tf_info_filtering(&cpi->ppi->tf_info,cpi,gf_group);
    return;
  }
  pFVar24 = (cpi->twopass_frame).stats_in;
  aVar5 = (cpi->oxcf).pass;
  if (aVar5 < AOM_RC_LAST_PASS) {
    if (((aVar5 == AOM_RC_ONE_PASS) && (cpi->compressor_stage == '\0')) &&
       (pAVar6->lap_enabled != 0 && pFVar24 == (FIRSTPASS_STATS *)0x0)) {
      return;
    }
  }
  else if (pFVar24 == (FIRSTPASS_STATS *)0x0) {
    return;
  }
  iVar11 = is_forced_keyframe_pending
                     (pAVar6->lookahead,pAVar6->lookahead->max_sz,cpi->compressor_stage);
  if (iVar11 == 0) {
    (cpi->rc).frames_to_key = 0;
  }
  else if ((0 < iVar11) && (iVar11 < (cpi->rc).frames_to_key)) {
    (cpi->rc).frames_to_key = iVar11;
  }
  bVar4 = cpi->gf_frame_index;
  FVar3 = (pAVar6->gf_group).update_type[bVar4];
  frame_params->frame_type = (pAVar6->gf_group).frame_type[bVar4];
  if ((((frame_flags & 1) == 0) && ((int)(uint)bVar4 < (pAVar6->gf_group).size)) &&
     ((setup_target_rate(cpi), FVar3 == '\x06' || (FVar3 == '\x03')))) {
    pFVar24 = (cpi->twopass_frame).stats_in;
    if (pFVar24 == (FIRSTPASS_STATS *)0x0) {
      return;
    }
    pFVar24 = pFVar24 + (pAVar6->gf_group).arf_src_offset[cpi->gf_frame_index];
    if (((pAVar6->twopass).stats_buf_ctx)->stats_in_end <= pFVar24) {
      return;
    }
    dVar26 = log1p(pFVar24->intra_error);
    (cpi->twopass_frame).mb_av_energy = dVar26;
    pdVar1 = &((cpi->ppi->twopass).stats_buf_ctx)->total_stats->frame_avg_wavelet_energy;
    if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
      dVar26 = log1p(pFVar24->frame_avg_wavelet_energy);
      (cpi->twopass_frame).frame_avg_haar_energy = dVar26;
    }
    (cpi->twopass_frame).fr_content_type = 0.15 <= pFVar24->intra_skip_pct;
    return;
  }
  if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
    (cpi->rc).active_worst_quality = (cpi->oxcf).rc_cfg.cq_level;
  }
  if (((((pAVar6->gf_group).size == (uint)cpi->gf_frame_index) && (cpi->ppi->lap_enabled != 0)) &&
      ((cpi->ppi->p_rc).enable_scenecut_detection != 0)) &&
     (iVar11 = define_kf_interval(cpi,&(pAVar6->twopass).firstpass_info,0x11,0), iVar11 != -1)) {
    iVar18 = (cpi->rc).frames_to_key;
    if (iVar18 < iVar11) {
      iVar11 = iVar18;
    }
    (cpi->rc).frames_to_key = iVar11;
  }
  memset(&local_200,0,0xe8);
  aVar5 = (cpi->oxcf).pass;
  if ((aVar5 < AOM_RC_LAST_PASS) &&
     (((aVar5 != AOM_RC_ONE_PASS || (cpi->compressor_stage != '\0')) || (cpi->ppi->lap_enabled == 0)
      ))) {
    (cpi->rc).active_worst_quality = (cpi->oxcf).rc_cfg.cq_level;
    bVar10 = true;
  }
  else if (((int)(uint)cpi->gf_frame_index < (pAVar6->gf_group).size) ||
          (bVar10 = true, (cpi->rc).frames_to_key == 0)) {
    process_first_pass_stats(cpi,&local_200);
    bVar10 = false;
  }
  memcpy(local_118,&local_200,0xe8);
  if (0 < (cpi->rc).frames_to_key) goto LAB_001f6f53;
  frame_params->frame_type = '\0';
  pAVar7 = cpi->ppi;
  (cpi->rc).frames_since_key = 0;
  (pAVar7->p_rc).use_arf_in_this_kf_group =
       (uint)(byte)(2 < (cpi->oxcf).gf_cfg.lag_in_frames & (cpi->oxcf).gf_cfg.enable_auto_arf);
  memset(&pAVar7->gf_group,0,0x58f4);
  cpi->gf_frame_index = '\0';
  (cpi->rc).frames_till_gf_update_due = 0;
  if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) {
    lookahead = cpi->ppi->lookahead;
    iVar11 = is_forced_keyframe_pending(lookahead,lookahead->max_sz,cpi->compressor_stage);
    if ((cpi->common).current_frame.frame_number == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (uint)((cpi->rc).frames_to_key == 0);
    }
    (pAVar7->p_rc).this_key_frame_forced = uVar13;
    if (iVar11 == -1) {
      iVar18 = (cpi->oxcf).kf_cfg.key_freq_max;
      iVar11 = 1;
      if (1 < iVar18) {
        iVar11 = iVar18;
      }
    }
    (cpi->rc).frames_to_key = iVar11;
    correct_frames_to_key(cpi);
    (pAVar7->p_rc).kf_boost = 0x8fc;
    (pAVar7->gf_group).update_type[0] = '\0';
  }
  else {
    firstpass_info = &(pAVar7->twopass).firstpass_info;
    pFVar8 = (cpi->twopass_frame).stats_in;
    local_210 = 1.0;
    local_218 = 0.0;
    (pAVar7->p_rc).this_key_frame_forced = (pAVar7->p_rc).next_key_frame_forced;
    (pAVar7->twopass).kf_group_bits = 0;
    (pAVar7->twopass).kf_group_error_left = 0.0;
    local_208 = calculate_modified_err_new
                          (&cpi->frame_info,((pAVar7->twopass).stats_buf_ctx)->total_stats,
                           &local_200,(cpi->oxcf).rc_cfg.vbrbias,
                           (pAVar7->twopass).modified_error_min,(pAVar7->twopass).modified_error_max
                          );
    iVar12 = define_kf_interval(cpi,firstpass_info,(cpi->oxcf).kf_cfg.key_freq_max,1);
    iVar11 = (cpi->oxcf).kf_cfg.key_freq_max;
    iVar18 = iVar12;
    if (iVar11 < iVar12) {
      iVar18 = iVar11;
    }
    if (iVar12 == -1) {
      iVar18 = iVar11;
    }
    (cpi->rc).frames_to_key = iVar18;
    if (cpi->ppi->lap_enabled != 0) {
      correct_frames_to_key(cpi);
    }
    if (((cpi->oxcf).kf_cfg.auto_key == true) &&
       (iVar11 = (cpi->rc).frames_to_key, (cpi->oxcf).kf_cfg.key_freq_max < iVar11)) {
      iVar18 = iVar11 / 2;
      (cpi->rc).frames_to_key = iVar18;
      (cpi->twopass_frame).stats_in = pFVar8;
      uVar13 = 1;
      if (1 < iVar11) {
        pFVar15 = ((pAVar7->twopass).stats_buf_ctx)->stats_in_end;
        pFVar20 = pFVar8;
        iVar11 = iVar18;
        do {
          if (pFVar15 <= pFVar20) break;
          pFVar20 = pFVar20 + 1;
          (cpi->twopass_frame).stats_in = pFVar20;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
    }
    else {
      if ((cpi->twopass_frame).stats_in == ((pAVar7->twopass).stats_buf_ctx)->stats_in_end) {
        iVar18 = (cpi->rc).frames_to_key;
        uVar13 = 1;
        if (AOM_RC_FIRST_PASS < (cpi->oxcf).pass) goto LAB_001f693c;
      }
      else {
        iVar18 = (cpi->rc).frames_to_key;
      }
      uVar13 = (uint)((cpi->oxcf).kf_cfg.key_freq_max <= iVar18);
    }
LAB_001f693c:
    (pAVar7->p_rc).next_key_frame_forced = uVar13;
    if (iVar18 < 1) {
      dVar26 = 0.0;
    }
    else {
      dVar26 = 0.0;
      iVar11 = 0;
      do {
        pFVar15 = av1_firstpass_info_peek(firstpass_info,iVar11);
        if (pFVar15 != (FIRSTPASS_STATS *)0x0) {
          dVar27 = calculate_modified_err_new
                             (&cpi->frame_info,&(pAVar7->twopass).firstpass_info.total_stats,pFVar15
                              ,(cpi->oxcf).rc_cfg.vbrbias,(pAVar7->twopass).modified_error_min,
                              (pAVar7->twopass).modified_error_max);
          dVar26 = dVar26 + dVar27;
          piVar21 = &(pAVar7->p_rc).num_stats_used_for_kf_boost;
          *piVar21 = *piVar21 + 1;
        }
        iVar11 = iVar11 + 1;
        iVar18 = (cpi->rc).frames_to_key;
      } while (iVar11 < iVar18);
    }
    piVar2 = &(pAVar7->twopass).kf_group_bits;
    if (((pAVar7->twopass).bits_left < 1) || ((pAVar7->twopass).modified_error_left <= 0.0)) {
      if (cpi->ppi->lap_enabled != 0) {
        if ((cpi->oxcf).rc_cfg.mode != AOM_Q) goto LAB_001f6a17;
        lVar23 = 0;
        goto LAB_001f6b92;
      }
      *piVar2 = 0;
LAB_001f6c24:
      lVar23 = 0x7fffffffffffffff;
      iVar11 = 0x7fffffff;
    }
    else {
LAB_001f6a17:
      lVar17 = (long)(cpi->rc).avg_frame_bandwidth;
      lVar23 = (cpi->oxcf).rc_cfg.vbrmax_section * lVar17;
      if (lVar23 < -99) {
        lVar23 = 0;
      }
      else {
        lVar23 = lVar23 / 100;
        lVar19 = (long)(cpi->rc).max_frame_bandwidth;
        if (lVar19 <= lVar23) {
          lVar23 = lVar19;
        }
      }
      uVar31 = SUB84(local_200.coded_error,0);
      uVar32 = (undefined4)((ulong)local_200.coded_error >> 0x20);
      uVar13 = (cpi->oxcf).rc_cfg.vbr_corpus_complexity_lap;
      if (uVar13 == 0) {
        pAVar22 = cpi->ppi;
        if (pAVar22->lap_enabled == 0) goto LAB_001f6bde;
        lVar17 = lVar17 * iVar18;
      }
      else {
        if (iVar18 < 1) {
          dVar27 = 0.0;
          iVar11 = 1;
        }
        else {
          pFVar15 = ((pAVar7->twopass).stats_buf_ctx)->stats_in_end;
          iVar12 = 0;
          dVar27 = 0.0;
          pFVar20 = pFVar8;
          do {
            dVar27 = dVar27 + (double)CONCAT44(uVar32,uVar31);
            iVar11 = iVar12;
            if (pFVar15 <= pFVar20) break;
            uVar31 = SUB84(pFVar20->coded_error,0);
            uVar32 = (undefined4)((ulong)pFVar20->coded_error >> 0x20);
            pFVar20 = pFVar20 + 1;
            (cpi->twopass_frame).stats_in = pFVar20;
            iVar12 = iVar12 + 1;
            iVar11 = iVar18;
          } while (iVar18 != iVar12);
          iVar11 = iVar11 + 1;
        }
        pAVar22 = cpi->ppi;
        if (pAVar22->lap_enabled == 0) {
LAB_001f6bde:
          lVar19 = (long)((dVar26 / (pAVar22->twopass).modified_error_left) *
                         (double)(pAVar22->twopass).bits_left);
          lVar17 = lVar23 * iVar18;
          if (lVar19 < lVar23 * iVar18) {
            lVar17 = lVar19;
          }
          lVar23 = 0;
          if (0 < lVar17) {
            lVar23 = lVar17;
          }
          *piVar2 = lVar23;
          goto LAB_001f6c24;
        }
        if (iVar18 <= iVar11) {
          iVar11 = iVar18;
        }
        auVar29._8_8_ = (double)uVar13;
        auVar29._0_8_ = dVar27;
        auVar30._8_4_ = 0;
        auVar30._0_8_ = (double)iVar11;
        auVar30._12_4_ = 0x40240000;
        auVar30 = divpd(auVar29,auVar30);
        lVar17 = (long)((auVar30._0_8_ / auVar30._8_8_) * (double)(lVar17 * iVar18));
      }
      lVar19 = iVar18 * lVar23;
      if (lVar17 < iVar18 * lVar23) {
        lVar19 = lVar17;
      }
      lVar23 = 0;
      if (0 < lVar19) {
        lVar23 = lVar19;
      }
LAB_001f6b92:
      *piVar2 = lVar23;
      iVar11 = (int)(cpi->framerate * 5.0);
      if (iVar11 < iVar18) {
        lVar23 = (long)(((double)iVar11 * (double)lVar23) / (double)iVar18);
      }
      else {
        lVar23 = 0x7fffffffffffffff;
      }
    }
    (cpi->twopass_frame).stats_in = pFVar8;
    dVar28 = get_kf_boost_score(cpi,local_200.intra_error,&local_210,&local_218,0);
    dVar34 = local_210;
    (cpi->twopass_frame).stats_in = pFVar8;
    (pAVar7->twopass).kf_zeromotion_pct = (int)(local_210 * 100.0);
    pFVar15 = ((pAVar7->twopass).stats_buf_ctx)->stats_in_end;
    iVar18 = (cpi->rc).frames_to_key;
    dVar33 = 0.0;
    dVar27 = 0.0;
    if (0 < iVar18 && pFVar8 < pFVar15) {
      iVar12 = 1;
      pFVar20 = pFVar8;
      dVar27 = 0.0;
      do {
        dVar33 = dVar33 + pFVar20->intra_error;
        dVar27 = dVar27 + pFVar20->coded_error;
        if (pFVar15 <= pFVar20 + 1) break;
        bVar25 = iVar12 < iVar18;
        iVar12 = iVar12 + 1;
        pFVar20 = pFVar20 + 1;
      } while (bVar25);
    }
    (pAVar7->twopass).section_intra_rating =
         (int)(dVar33 / (dVar27 + *(double *)(&DAT_004dfff0 + (ulong)(dVar27 < 0.0) * 8)));
    iVar12 = (int)dVar28;
    (pAVar7->p_rc).kf_boost = iVar12;
    pAVar22 = cpi->ppi;
    if (pAVar22->lap_enabled != 0) {
      if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
        if ((pAVar22->p_rc).num_stats_used_for_kf_boost < iVar18) {
          dVar27 = (double)iVar18;
          if (dVar27 < 0.0) {
            dVar27 = sqrt(dVar27);
          }
          else {
            dVar27 = SQRT(dVar27);
          }
          if (10.0 <= dVar27) {
            dVar27 = 10.0;
          }
          if (dVar27 <= 4.0) {
            dVar27 = 4.0;
          }
          dVar28 = (double)(cpi->ppi->p_rc).num_stats_used_for_kf_boost;
          if (dVar28 < 0.0) {
            dVar28 = sqrt(dVar28);
          }
          else {
            dVar28 = SQRT(dVar28);
          }
          if (10.0 <= dVar28) {
            dVar28 = 10.0;
          }
          if (dVar28 <= 4.0) {
            dVar28 = 4.0;
          }
          dVar27 = rint(((dVar27 * 14.0 + 75.0) * (double)(cpi->ppi->p_rc).kf_boost) /
                        (dVar28 * 14.0 + 75.0));
          iVar12 = (int)dVar27;
        }
        else {
          iVar12 = (pAVar22->p_rc).kf_boost;
        }
      }
      else {
        dVar27 = get_kf_boost_score(cpi,local_200.intra_error,&local_210,&local_218,1);
        (cpi->twopass_frame).stats_in = pFVar8;
        iVar12 = (int)dVar27 + (pAVar7->p_rc).kf_boost;
        dVar34 = local_210;
      }
    }
    iVar18 = (cpi->rc).frames_to_key;
    if (iVar18 < 9 || dVar34 <= 0.99) {
      iVar16 = iVar18 * 3;
      if (iVar12 != iVar16 && SBORROW4(iVar12,iVar16) == iVar12 + iVar18 * -3 < 0) {
        iVar16 = iVar12;
      }
      boost = 600;
      if (600 < iVar16) {
        boost = iVar16;
      }
    }
    else {
      boost = 0x1518;
      if (0x1518 < iVar12) {
        boost = iVar12;
      }
    }
    (pAVar7->p_rc).kf_boost = boost;
    if (iVar18 < iVar11) {
      iVar11 = iVar18;
    }
    lVar17 = (pAVar7->twopass).kf_group_bits;
    if (lVar17 < lVar23) {
      lVar23 = lVar17;
    }
    iVar11 = calculate_boost_bits(iVar11 + -1,boost,lVar23);
    iVar11 = adjust_boost_bits_for_target_level(cpi,&cpi->rc,iVar11,lVar17,0);
    piVar2 = &(pAVar7->twopass).kf_group_bits;
    *piVar2 = *piVar2 - (long)iVar11;
    (pAVar7->gf_group).bit_allocation[0] = iVar11;
    (pAVar7->gf_group).update_type[0] = '\0';
    if (cpi->ppi->lap_enabled == 0) {
      dVar27 = dVar26 - local_208;
    }
    else {
      dVar27 = (double)((cpi->rc).frames_to_key + -1);
    }
    (pAVar7->twopass).kf_group_error_left = dVar27;
    (pAVar7->twopass).modified_error_left = (pAVar7->twopass).modified_error_left - dVar26;
  }
  memcpy(&local_200,local_118,0xe8);
LAB_001f6f53:
  if ((cpi->rc).frames_to_fwd_kf < 1) {
    (cpi->rc).frames_to_fwd_kf = (cpi->oxcf).kf_cfg.fwd_kf_dist;
  }
  bVar4 = cpi->gf_frame_index;
  if ((pAVar6->gf_group).size == (uint)bVar4) {
    av1_tf_info_reset(&cpi->ppi->tf_info);
    iVar11 = (cpi->oxcf).gf_cfg.lag_in_frames;
    iVar18 = 0x10;
    if (0x1f < iVar11) {
      iVar12 = iVar11 - (cpi->oxcf).algo_cfg.arnr_max_frames / 2;
      iVar18 = 0x20;
      if (iVar12 < 0x20) {
        iVar18 = iVar12;
      }
    }
    if ((0 < (cpi->oxcf).kf_cfg.fwd_kf_dist) &&
       (iVar12 = (cpi->rc).frames_to_fwd_kf + 1, iVar12 < iVar18)) {
      iVar18 = iVar12;
    }
    if (iVar11 == 0) {
      iVar18 = (cpi->rc).max_gf_interval;
    }
    iVar11 = (cpi->rc).frames_to_key;
    uVar13 = (cpi->rc).frames_since_key;
    if (iVar11 <= iVar18) {
      iVar18 = iVar11;
    }
    if ((uVar13 < 2) ||
       ((iVar12 = (pAVar6->p_rc).frames_till_regions_update - uVar13, iVar12 < iVar11 &&
        (iVar12 <= iVar18)))) {
      pSVar9 = (pAVar6->twopass).stats_buf_ctx;
      pFVar8 = pSVar9->stats_in_end;
      pFVar15 = (cpi->twopass_frame).stats_in;
      iVar12 = (int)((ulong)((long)pFVar8 - (long)pFVar15) >> 3) * 0x4f72c235 + (uint)(uVar13 == 0);
      if (iVar11 < iVar12) {
        iVar12 = iVar11;
      }
      if (0x95 < iVar12) {
        iVar12 = 0x96;
      }
      (pAVar6->p_rc).frames_till_regions_update = iVar12;
      if (cpi->ppi->lap_enabled == 0) {
        pFVar15 = pFVar15 + -(ulong)(uVar13 == 0);
        uVar13 = 0;
      }
      else {
        pFVar20 = pSVar9->stats_in_start;
        for (pFVar15 = pFVar20; pFVar15 < pFVar8 + -1; pFVar15 = pFVar15 + 1) {
          pFVar15->is_flash =
               (ulong)(-(uint)(0.5 <= pFVar15[1].pcnt_second_ref &&
                              pFVar15[1].pcnt_inter < pFVar15[1].pcnt_second_ref) & 1);
        }
        if (pFVar20 <= pFVar8 + -1) {
          pFVar8[-1].is_flash = 0;
        }
        estimate_noise(pFVar20,pFVar8,(cpi->common).error);
        pSVar9 = (pAVar6->twopass).stats_buf_ctx;
        estimate_coeff(pSVar9->stats_in_start,pSVar9->stats_in_end);
        pFVar15 = (cpi->twopass_frame).stats_in;
        uVar13 = (uint)((cpi->rc).frames_since_key == 0);
      }
      iVar11 = identify_regions(pFVar15,iVar12,uVar13,(pAVar6->p_rc).regions,
                                &(pAVar6->p_rc).num_regions);
      if (iVar11 == -1) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Error allocating buffers in identify_regions");
      }
    }
    lVar23 = (long)(pAVar6->p_rc).num_regions;
    iVar11 = (cpi->rc).frames_since_key;
    if (0 < lVar23) {
      iVar12 = iVar11 - (pAVar6->p_rc).regions_offset;
      lVar17 = 0;
      do {
        if ((*(int *)((long)&(pAVar6->p_rc).regions[0].start + lVar17) <= iVar12) &&
           (iVar12 <= *(int *)((long)&(pAVar6->p_rc).regions[0].last + lVar17))) {
          if (iVar11 != 0 && *(int *)((long)&(pAVar6->p_rc).regions[0].type + lVar17) != 2)
          goto LAB_001f71b4;
          goto LAB_001f71a7;
        }
        lVar17 = lVar17 + 0x38;
      } while (lVar23 * 0x38 - lVar17 != 0);
    }
    if (iVar11 == 0) {
LAB_001f71a7:
      (cpi->ppi->gf_state).arf_gf_boost_lst = 0;
    }
LAB_001f71b4:
    calculate_gf_length(cpi,iVar18,0xf);
    if ((((0x10 < iVar18) && ((cpi->oxcf).algo_cfg.enable_tpl_model == true)) &&
        (0x1f < (cpi->oxcf).gf_cfg.lag_in_frames)) &&
       ((cpi->sf).tpl_sf.gop_length_decision_method != 3)) {
      iVar11 = (pAVar6->p_rc).gf_intervals[(pAVar6->p_rc).cur_gf_index];
      lVar23 = (long)(pAVar6->p_rc).num_regions;
      if (lVar23 < 1) {
        bVar25 = (cpi->rc).frames_to_key <= iVar11;
      }
      else {
        iVar18 = ((cpi->rc).frames_since_key + iVar11) - (pAVar6->p_rc).regions_offset;
        piVar21 = &(pAVar6->p_rc).regions[0].last;
        lVar17 = 0;
        do {
          if ((((REGIONS *)(piVar21 + -1))->start < iVar18) && (iVar18 + -1 <= *piVar21))
          goto LAB_001f724b;
          lVar17 = lVar17 + 1;
          piVar21 = piVar21 + 0xe;
        } while (lVar23 != lVar17);
        lVar17 = 0xffffffff;
LAB_001f724b:
        piVar21 = &(pAVar6->p_rc).regions[0].last;
        lVar19 = 0;
        do {
          if ((((REGIONS *)(piVar21 + -1))->start <= iVar18) && (iVar18 <= *piVar21))
          goto LAB_001f726f;
          lVar19 = lVar19 + 1;
          piVar21 = piVar21 + 0xe;
        } while (lVar23 != lVar19);
        lVar19 = 0xffffffff;
LAB_001f726f:
        bVar25 = true;
        if ((iVar11 < (cpi->rc).frames_to_key) &&
           (((int)lVar17 == -1 || ((pAVar6->p_rc).regions[(int)lVar17].type != SCENECUT_REGION)))) {
          if ((int)lVar19 == -1) {
            bVar25 = false;
          }
          else {
            bVar25 = (pAVar6->p_rc).regions[(int)lVar19].type == SCENECUT_REGION;
          }
        }
      }
      if ((0x10 < iVar11) && ((cpi->rc).min_gf_interval < 0x11)) {
        define_gf_group(cpi,frame_params,0);
        av1_tf_info_filtering(&cpi->ppi->tf_info,cpi,gf_group);
        memcpy(&local_200,local_118,0xe8);
        iVar18 = is_shorter_gf_interval_better(cpi,frame_params);
        if ((iVar18 != 0) &&
           ((calculate_gf_length(cpi,0x10,1), bVar25 &&
            (iVar18 = (pAVar6->p_rc).cur_gf_index, iVar11 - (pAVar6->p_rc).gf_intervals[iVar18] < 4)
            ))) {
          (pAVar6->p_rc).gf_intervals[iVar18] = iVar11;
        }
      }
    }
    define_gf_group(cpi,frame_params,0);
    if ((gf_group->update_type[cpi->gf_frame_index] != '\x03') && (0 < (cpi->rc).frames_since_key))
    {
      process_first_pass_stats(cpi,&local_200);
    }
    define_gf_group(cpi,frame_params,1);
    av1_tf_info_filtering(&cpi->ppi->tf_info,cpi,gf_group);
    (cpi->rc).frames_till_gf_update_due = (pAVar6->p_rc).baseline_gf_interval;
    bVar4 = cpi->gf_frame_index;
  }
  uVar14 = (ulong)bVar4;
  if ((gf_group->update_type[uVar14] == '\x06') || (gf_group->update_type[uVar14] == '\x03')) {
    (cpi->twopass_frame).stats_in = pFVar24;
    if ((pFVar24 != (FIRSTPASS_STATS *)0x0) &&
       (pFVar24 = pFVar24 + (pAVar6->gf_group).arf_src_offset[uVar14],
       pFVar24 < ((pAVar6->twopass).stats_buf_ctx)->stats_in_end)) {
      dVar26 = log1p(pFVar24->intra_error);
      (cpi->twopass_frame).mb_av_energy = dVar26;
      pdVar1 = &((cpi->ppi->twopass).stats_buf_ctx)->total_stats->frame_avg_wavelet_energy;
      if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
        dVar26 = log1p(pFVar24->frame_avg_wavelet_energy);
        (cpi->twopass_frame).frame_avg_haar_energy = dVar26;
      }
      (cpi->twopass_frame).fr_content_type = 0.15 <= pFVar24->intra_skip_pct;
      uVar14 = (ulong)cpi->gf_frame_index;
    }
  }
  else {
    if (bVar10) {
      pFVar24 = (FIRSTPASS_STATS *)0x0;
    }
    (cpi->twopass_frame).this_frame = pFVar24;
  }
  frame_params->frame_type = (pAVar6->gf_group).frame_type[uVar14];
  setup_target_rate(cpi);
  return;
}

Assistant:

void av1_get_second_pass_params(AV1_COMP *cpi,
                                EncodeFrameParams *const frame_params,
                                unsigned int frame_flags) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  if (cpi->use_ducky_encode &&
      cpi->ducky_encode_info.frame_info.gop_mode == DUCKY_ENCODE_GOP_MODE_RCL) {
    frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];
    frame_params->show_frame =
        !(gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE);
    if (cpi->gf_frame_index == 0) {
      av1_tf_info_reset(&cpi->ppi->tf_info);
      av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);
    }
    return;
  }

  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  int update_total_stats = 0;

  if (is_stat_consumption_stage(cpi) && !cpi->twopass_frame.stats_in) return;

  // Check forced key frames.
  const int frames_to_next_forced_key = detect_app_forced_key(cpi);
  if (frames_to_next_forced_key == 0) {
    rc->frames_to_key = 0;
    frame_flags &= FRAMEFLAGS_KEY;
  } else if (frames_to_next_forced_key > 0 &&
             frames_to_next_forced_key < rc->frames_to_key) {
    rc->frames_to_key = frames_to_next_forced_key;
  }

  assert(cpi->twopass_frame.stats_in != NULL);
  const int update_type = gf_group->update_type[cpi->gf_frame_index];
  frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];

  if (cpi->gf_frame_index < gf_group->size && !(frame_flags & FRAMEFLAGS_KEY)) {
    assert(cpi->gf_frame_index < gf_group->size);

    setup_target_rate(cpi);

    // If this is an arf frame then we dont want to read the stats file or
    // advance the input pointer as we already have what we need.
    if (update_type == ARF_UPDATE || update_type == INTNL_ARF_UPDATE) {
      const FIRSTPASS_STATS *const this_frame_ptr =
          read_frame_stats(twopass, &cpi->twopass_frame,
                           gf_group->arf_src_offset[cpi->gf_frame_index]);
      set_twopass_params_based_on_fp_stats(cpi, this_frame_ptr);
      return;
    }
  }

  if (oxcf->rc_cfg.mode == AOM_Q)
    rc->active_worst_quality = oxcf->rc_cfg.cq_level;

  if (cpi->gf_frame_index == gf_group->size) {
    if (cpi->ppi->lap_enabled && cpi->ppi->p_rc.enable_scenecut_detection) {
      const int num_frames_to_detect_scenecut = MAX_GF_LENGTH_LAP + 1;
      const int frames_to_key = define_kf_interval(
          cpi, &twopass->firstpass_info, num_frames_to_detect_scenecut,
          /*search_start_idx=*/0);
      if (frames_to_key != -1)
        rc->frames_to_key = AOMMIN(rc->frames_to_key, frames_to_key);
    }
  }

  FIRSTPASS_STATS this_frame;
  av1_zero(this_frame);
  // call above fn
  if (is_stat_consumption_stage(cpi)) {
    if (cpi->gf_frame_index < gf_group->size || rc->frames_to_key == 0) {
      process_first_pass_stats(cpi, &this_frame);
      update_total_stats = 1;
    }
  } else {
    rc->active_worst_quality = oxcf->rc_cfg.cq_level;
  }

  // Keyframe and section processing.
  FIRSTPASS_STATS this_frame_copy;
  this_frame_copy = this_frame;
  if (rc->frames_to_key <= 0) {
    assert(rc->frames_to_key == 0);
    // Define next KF group and assign bits to it.
    frame_params->frame_type = KEY_FRAME;
    find_next_key_frame(cpi, &this_frame);
    this_frame = this_frame_copy;
  }

  if (rc->frames_to_fwd_kf <= 0)
    rc->frames_to_fwd_kf = oxcf->kf_cfg.fwd_kf_dist;

  // Define a new GF/ARF group. (Should always enter here for key frames).
  if (cpi->gf_frame_index == gf_group->size) {
    av1_tf_info_reset(&cpi->ppi->tf_info);
#if CONFIG_BITRATE_ACCURACY && !CONFIG_THREE_PASS
    vbr_rc_reset_gop_data(&cpi->vbr_rc_info);
#endif  // CONFIG_BITRATE_ACCURACY
    int max_gop_length =
        (oxcf->gf_cfg.lag_in_frames >= 32)
            ? AOMMIN(MAX_GF_INTERVAL, oxcf->gf_cfg.lag_in_frames -
                                          oxcf->algo_cfg.arnr_max_frames / 2)
            : MAX_GF_LENGTH_LAP;

    // Handle forward key frame when enabled.
    if (oxcf->kf_cfg.fwd_kf_dist > 0)
      max_gop_length = AOMMIN(rc->frames_to_fwd_kf + 1, max_gop_length);

    // Use the provided gop size in low delay setting
    if (oxcf->gf_cfg.lag_in_frames == 0) max_gop_length = rc->max_gf_interval;

    // Limit the max gop length for the last gop in 1 pass setting.
    max_gop_length = AOMMIN(max_gop_length, rc->frames_to_key);

    // Identify regions if needed.
    // TODO(bohanli): identify regions for all stats available.
    if (rc->frames_since_key == 0 || rc->frames_since_key == 1 ||
        (p_rc->frames_till_regions_update - rc->frames_since_key <
             rc->frames_to_key &&
         p_rc->frames_till_regions_update - rc->frames_since_key <
             max_gop_length + 1)) {
      // how many frames we can analyze from this frame
      int rest_frames =
          AOMMIN(rc->frames_to_key, MAX_FIRSTPASS_ANALYSIS_FRAMES);
      rest_frames =
          AOMMIN(rest_frames, (int)(twopass->stats_buf_ctx->stats_in_end -
                                    cpi->twopass_frame.stats_in +
                                    (rc->frames_since_key == 0)));
      p_rc->frames_till_regions_update = rest_frames;

      int ret;
      if (cpi->ppi->lap_enabled) {
        mark_flashes(twopass->stats_buf_ctx->stats_in_start,
                     twopass->stats_buf_ctx->stats_in_end);
        estimate_noise(twopass->stats_buf_ctx->stats_in_start,
                       twopass->stats_buf_ctx->stats_in_end, cpi->common.error);
        estimate_coeff(twopass->stats_buf_ctx->stats_in_start,
                       twopass->stats_buf_ctx->stats_in_end);
        ret = identify_regions(cpi->twopass_frame.stats_in, rest_frames,
                               (rc->frames_since_key == 0), p_rc->regions,
                               &p_rc->num_regions);
      } else {
        ret = identify_regions(
            cpi->twopass_frame.stats_in - (rc->frames_since_key == 0),
            rest_frames, 0, p_rc->regions, &p_rc->num_regions);
      }
      if (ret == -1) {
        aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                           "Error allocating buffers in identify_regions");
      }
    }

    int cur_region_idx =
        find_regions_index(p_rc->regions, p_rc->num_regions,
                           rc->frames_since_key - p_rc->regions_offset);
    if ((cur_region_idx >= 0 &&
         p_rc->regions[cur_region_idx].type == SCENECUT_REGION) ||
        rc->frames_since_key == 0) {
      // If we start from a scenecut, then the last GOP's arf boost is not
      // needed for this GOP.
      cpi->ppi->gf_state.arf_gf_boost_lst = 0;
    }

    int need_gf_len = 1;
#if CONFIG_THREE_PASS
    if (cpi->third_pass_ctx && oxcf->pass == AOM_RC_THIRD_PASS) {
      // set up bitstream to read
      if (!cpi->third_pass_ctx->input_file_name && oxcf->two_pass_output) {
        cpi->third_pass_ctx->input_file_name = oxcf->two_pass_output;
      }
      av1_open_second_pass_log(cpi, 1);
      THIRD_PASS_GOP_INFO *gop_info = &cpi->third_pass_ctx->gop_info;
      // Read in GOP information from the second pass file.
      av1_read_second_pass_gop_info(cpi->second_pass_log_stream, gop_info,
                                    cpi->common.error);
#if CONFIG_BITRATE_ACCURACY
      TPL_INFO *tpl_info;
      AOM_CHECK_MEM_ERROR(cpi->common.error, tpl_info,
                          aom_malloc(sizeof(*tpl_info)));
      av1_read_tpl_info(tpl_info, cpi->second_pass_log_stream,
                        cpi->common.error);
      aom_free(tpl_info);
#if CONFIG_THREE_PASS
      // TODO(angiebird): Put this part into a func
      cpi->vbr_rc_info.cur_gop_idx++;
#endif  // CONFIG_THREE_PASS
#endif  // CONFIG_BITRATE_ACCURACY
      // Read in third_pass_info from the bitstream.
      av1_set_gop_third_pass(cpi->third_pass_ctx);
      // Read in per-frame info from second-pass encoding
      av1_read_second_pass_per_frame_info(
          cpi->second_pass_log_stream, cpi->third_pass_ctx->frame_info,
          gop_info->num_frames, cpi->common.error);

      p_rc->cur_gf_index = 0;
      p_rc->gf_intervals[0] = cpi->third_pass_ctx->gop_info.gf_length;
      need_gf_len = 0;
    }
#endif  // CONFIG_THREE_PASS

    if (need_gf_len) {
      // If we cannot obtain GF group length from second_pass_file
      // TODO(jingning): Resolve the redundant calls here.
      if (rc->intervals_till_gf_calculate_due == 0 || 1) {
        calculate_gf_length(cpi, max_gop_length, MAX_NUM_GF_INTERVALS);
      }

      if (max_gop_length > 16 && oxcf->algo_cfg.enable_tpl_model &&
          oxcf->gf_cfg.lag_in_frames >= 32 &&
          cpi->sf.tpl_sf.gop_length_decision_method != 3) {
        int this_idx = rc->frames_since_key +
                       p_rc->gf_intervals[p_rc->cur_gf_index] -
                       p_rc->regions_offset - 1;
        int this_region =
            find_regions_index(p_rc->regions, p_rc->num_regions, this_idx);
        int next_region =
            find_regions_index(p_rc->regions, p_rc->num_regions, this_idx + 1);
        // TODO(angiebird): Figure out why this_region and next_region are -1 in
        // unit test like AltRefFramePresenceTestLarge (aomedia:3134)
        int is_last_scenecut =
            p_rc->gf_intervals[p_rc->cur_gf_index] >= rc->frames_to_key ||
            (this_region != -1 &&
             p_rc->regions[this_region].type == SCENECUT_REGION) ||
            (next_region != -1 &&
             p_rc->regions[next_region].type == SCENECUT_REGION);

        int ori_gf_int = p_rc->gf_intervals[p_rc->cur_gf_index];

        if (p_rc->gf_intervals[p_rc->cur_gf_index] > 16 &&
            rc->min_gf_interval <= 16) {
          // The calculate_gf_length function is previously used with
          // max_gop_length = 32 with look-ahead gf intervals.
          define_gf_group(cpi, frame_params, 0);
          av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);
          this_frame = this_frame_copy;

          if (is_shorter_gf_interval_better(cpi, frame_params)) {
            // A shorter gf interval is better.
            // TODO(jingning): Remove redundant computations here.
            max_gop_length = 16;
            calculate_gf_length(cpi, max_gop_length, 1);
            if (is_last_scenecut &&
                (ori_gf_int - p_rc->gf_intervals[p_rc->cur_gf_index] < 4)) {
              p_rc->gf_intervals[p_rc->cur_gf_index] = ori_gf_int;
            }
          }
        }
      }
    }

    define_gf_group(cpi, frame_params, 0);

    if (gf_group->update_type[cpi->gf_frame_index] != ARF_UPDATE &&
        rc->frames_since_key > 0)
      process_first_pass_stats(cpi, &this_frame);

    define_gf_group(cpi, frame_params, 1);

#if CONFIG_THREE_PASS
    // write gop info if needed for third pass. Per-frame info is written after
    // each frame is encoded.
    av1_write_second_pass_gop_info(cpi);
#endif  // CONFIG_THREE_PASS

    av1_tf_info_filtering(&cpi->ppi->tf_info, cpi, gf_group);

    rc->frames_till_gf_update_due = p_rc->baseline_gf_interval;
    assert(cpi->gf_frame_index == 0);
#if ARF_STATS_OUTPUT
    {
      FILE *fpfile;
      fpfile = fopen("arf.stt", "a");
      ++arf_count;
      fprintf(fpfile, "%10d %10d %10d %10d %10d\n",
              cpi->common.current_frame.frame_number,
              rc->frames_till_gf_update_due, cpi->ppi->p_rc.kf_boost, arf_count,
              p_rc->gfu_boost);

      fclose(fpfile);
    }
#endif
  }
  assert(cpi->gf_frame_index < gf_group->size);

  if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
      gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
    reset_fpf_position(&cpi->twopass_frame, start_pos);

    const FIRSTPASS_STATS *const this_frame_ptr =
        read_frame_stats(twopass, &cpi->twopass_frame,
                         gf_group->arf_src_offset[cpi->gf_frame_index]);
    set_twopass_params_based_on_fp_stats(cpi, this_frame_ptr);
  } else {
    // Back up this frame's stats for updating total stats during post encode.
    cpi->twopass_frame.this_frame = update_total_stats ? start_pos : NULL;
  }

  frame_params->frame_type = gf_group->frame_type[cpi->gf_frame_index];
  setup_target_rate(cpi);
}